

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O3

void __thiscall TinyGC::Mark(TinyGC *this)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  Elf64_Ehdr *pEVar3;
  _Hash_node_base *p_Var4;
  iterator iVar5;
  ostream *poVar6;
  undefined1 local_50 [8];
  unique_lock<std::mutex> lck;
  Elf64_Ehdr *local_38;
  GarbageCollectedBase *ptr;
  
  local_50 = (undefined1  [8])&this->ts_mxt_;
  lck._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
  lck._M_device._0_1_ = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nMark Start~",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  if (this->gc_phase_ == kNone) {
    this->gc_phase_ = kMarking;
    this->visitor_->mark_ = true;
    p_Var4 = (this->thread_to_stack_)._M_h._M_before_begin._M_nxt;
    while (p_Var4 != (_Hash_node_base *)0x0) {
      p_Var2 = p_Var4[2]._M_nxt;
      p_Var2[1]._M_nxt = (_Hash_node_base *)&stack0xfffffffffffffff8;
      p_Var2 = p_Var2->_M_nxt;
      lck._8_8_ = p_Var4;
      pEVar3 = local_38;
      for (p_Var4 = (_Hash_node_base *)&stack0xfffffffffffffff8; p_Var4 < p_Var2;
          p_Var4 = p_Var4 + 1) {
        local_38 = (Elf64_Ehdr *)p_Var4->_M_nxt;
        if ((&Elf64_Ehdr_00100000 < local_38) &&
           (iVar5 = std::
                    _Hashtable<GarbageCollectedBase_*,_GarbageCollectedBase_*,_std::allocator<GarbageCollectedBase_*>,_std::__detail::_Identity,_std::equal_to<GarbageCollectedBase_*>,_std::hash<GarbageCollectedBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find((_Hashtable<GarbageCollectedBase_*,_GarbageCollectedBase_*,_std::allocator<GarbageCollectedBase_*>,_std::__detail::_Identity,_std::equal_to<GarbageCollectedBase_*>,_std::hash<GarbageCollectedBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)this,(key_type *)&local_38), pEVar3 = local_38,
           iVar5.super__Node_iterator_base<GarbageCollectedBase_*,_false>._M_cur !=
           (__node_type *)0x0)) {
          if ((local_38 != (Elf64_Ehdr *)0x0) &&
             (bVar1 = this->visitor_->mark_, (bool)local_38->e_ident_abiversion != bVar1)) {
            local_38->e_ident_abiversion = bVar1;
            (*(code *)**(undefined8 **)&local_38->e_ident_magic_num)();
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"find object at ",0xf);
          *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
               *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8;
          poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pEVar3 = local_38;
        }
        local_38 = pEVar3;
        pEVar3 = local_38;
      }
      local_38 = pEVar3;
      p_Var4 = ((_Hash_node_base *)lck._8_8_)->_M_nxt;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
    return;
  }
  __assert_fail("gc_phase_ == GCPhase::kNone",
                "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                ,0x4f,"void TinyGC::SetGCPhase(GCPhase)");
}

Assistant:

void TinyGC::Mark() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  LOG("\nMark Start~");
  SetGCPhase(GCPhase::kMarking);
  visitor_->SetMark(true);

  for (auto &ts_ : thread_to_stack_) {
    ThreadState *ts = ts_.second;
    ts->GetCurrentStackPosition();
    intptr_t **start = reinterpret_cast<intptr_t **>(ts->GetStackEndAddr());
    intptr_t **end = reinterpret_cast<intptr_t **>(ts->GetStackStartAddr());
    for (; start < end; start++) {
      if (*start > (intptr_t *)0x100000) {
        GarbageCollectedBase *ptr =
            reinterpret_cast<GarbageCollectedBase *>(*start);
        if (objs_addr_.find(ptr) != objs_addr_.end()) {
          visitor_->ObjTrace((GarbageCollectedBase *)ptr);
          LOG("find object at " << std::hex << ptr);
        }
      }
    }
  }
}